

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmListFileBacktrace __thiscall
cmTargetInternals::GetBacktrace(cmTargetInternals *this,optional<cmListFileBacktrace> *bt)

{
  bool bVar1;
  cmListFileBacktrace *pcVar2;
  optional *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  cmListFileBacktrace cVar4;
  optional<cmListFileBacktrace> *bt_local;
  cmTargetInternals *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  bVar1 = std::optional::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    pcVar2 = std::optional<cmListFileBacktrace>::operator*((optional<cmListFileBacktrace> *)in_RDX);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)this,pcVar2);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    cVar4 = cmMakefile::GetBacktrace((cmMakefile *)this);
    _Var3._M_pi = cVar4.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
  }
  cVar4.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  cVar4.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar4.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

cmListFileBacktrace GetBacktrace(
    cm::optional<cmListFileBacktrace> const& bt) const
  {
    return bt ? *bt : this->Makefile->GetBacktrace();
  }